

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O0

uchar * __thiscall CVmRun::do_return(CVmRun *this)

{
  vm_obj_id_t vVar1;
  undefined4 uVar2;
  int iVar3;
  vm_val_t *pvVar4;
  vm_val_t v;
  pool_ofs_t caller_ofs;
  int argc;
  vm_val_t *fro;
  CVmObjFrameRef *in_stack_ffffffffffffffd0;
  anon_union_8_8_cb74652f_for_val local_28;
  uint local_20;
  
  pvVar4 = get_frameref_slot((vm_val_t *)0x233e85);
  if ((pvVar4->typ == VM_OBJ) && (iVar3 = CVmObjFrameRef::is_frameref_obj(0), iVar3 != 0)) {
    vm_objp(0);
    CVmObjFrameRef::inval_frame(in_stack_ffffffffffffffd0);
  }
  CVmStack::set_sp(frame_ptr_);
  pvVar4 = CVmStack::get(0);
  frame_ptr_ = (vm_val_t *)(pvVar4->val).native_desc;
  pvVar4 = CVmStack::get(1);
  vVar1 = (pvVar4->val).obj;
  pvVar4 = CVmStack::get(2);
  entry_ptr_native_ = (uchar *)(pvVar4->val).ptr;
  pvVar4 = CVmStack::get(3);
  local_20 = (pvVar4->val).obj;
  CVmStack::discard(vVar1 + 0xb);
  iVar3 = vmrun_is_special_return(local_20);
  if (iVar3 != 0) {
    if (local_20 == 0) {
      return (uchar *)0x0;
    }
    if (local_20 == 1) {
      pvVar4 = CVmStack::get(0);
      local_20 = (pvVar4->val).obj;
      pvVar4 = CVmStack::get(0);
      uVar2 = r0_._4_4_;
      pvVar4->typ = r0_.typ;
      *(undefined4 *)&pvVar4->field_0x4 = uVar2;
      pvVar4->val = r0_.val;
    }
    else {
      if (local_20 != 2) {
        err_throw(0);
      }
      CVmStack::pop((vm_val_t *)&stack0xffffffffffffffd0);
      pvVar4 = get_local(0);
      uVar2 = r0_._4_4_;
      pvVar4->typ = r0_.typ;
      *(undefined4 *)&pvVar4->field_0x4 = uVar2;
      pvVar4->val = r0_.val;
      CVmStack::pop((vm_val_t *)&stack0xffffffffffffffd0);
      local_20 = local_28.obj;
    }
  }
  if (entry_ptr_native_[local_20] == 0x8b) {
    CVmStack::push(&r0_);
    local_20 = local_20 + 1;
  }
  return entry_ptr_native_ + local_20;
}

Assistant:

const uchar *CVmRun::do_return(VMG0_)
{
    /* invalidate the frame reference object, if present */
    vm_val_t *fro = get_frameref_slot(vmg_ frame_ptr_);
    if (fro->typ == VM_OBJ
        && CVmObjFrameRef::is_frameref_obj(vmg_ fro->val.obj))
        ((CVmObjFrameRef *)vm_objp(vmg_ fro->val.obj))->inval_frame(vmg0_);

    /*
     *   The frame pointer always points to the location on the stack
     *   where we pushed the enclosing frame pointer.  Reset the stack
     *   pointer to the current frame pointer, then pop the enclosing
     *   frame pointer.  
     */
    set_sp(frame_ptr_);
    frame_ptr_ = (vm_val_t *)get(0)->val.ptr;

    /* get the enclosing argument count */
    int argc = get(1)->val.intval;

    /* restore the enclosing entry pointer */
    entry_ptr_native_ = (const uchar *)get(2)->val.ptr;

    /* restore the enclosing code offset */
    pool_ofs_t caller_ofs = get(3)->val.ofs;

    /* 
     *   Discard the actual parameters, plus the 'self', defining object,
     *   original target object, and target property values.  While we're at
     *   it, also discard the enclosing frame pointer, enclosing argument
     *   count, enclosing entry pointer, and enclosing code offset, which
     *   we've already restored.  
     */
    discard(argc + 11);

    /* leave the profiler stack level */
    VM_IF_PROFILER(if (profiling_)
        prof_leave());

    /* if we're debugging, notify the debugger of the return */
    VM_IF_DEBUGGER(G_debugger->step_return(vmg0_));

    /* 
     *   if this is a special return address code, execute the appropraite
     *   local subroutine 
     */
    if (vmrun_is_special_return(caller_ofs))
    {
        vm_val_t v;
        
        switch (caller_ofs)
        {
        case VMRUN_RET_RECURSIVE:
            /* 
             *   return from recursive VM invocation - just return 0 as the
             *   finishing offset to tell the caller to exit the bytecode
             *   execution loop 
             */
            return 0;

        case VMRUN_RET_OP:
            /* 
             *   returning from operator evaluation - push R0 as the operand
             *   result, and return to the address currently at TOS 
             */
            caller_ofs = get(0)->val.intval;
            *get(0) = r0_;
            break;

        case VMRUN_RET_OP_ASILCL:
            /*
             *   Returning from an operator evaluation, with assignment to a
             *   local.  The local variable number is at TOS; assign it, then
             *   return to the address next on the stack. 
             */
            pop(&v);
            *get_local(vmg_ v.val.intval) = r0_;
            pop(&v);
            caller_ofs = v.val.intval;
            break;

        default:
            /* 
             *   invalid address; we're going to dump into random code if we
             *   continue, so nip it in the bud and throw an invalid op now 
             */
            err_throw(VMERR_INVALID_OPCODE);
        }
    }

    /*
     *   Empirically, about half the time, the caller will push the return
     *   value onto the stack.  It's a little faster to test for that case
     *   here and handle it specially.  
     */
    if (*(entry_ptr_native_ + caller_ofs) == OPC_GETR0)
    {
        push(&r0_);
        caller_ofs += 1;
    }

    /* 
     *   return the new program counter - calculate the PC offset by adding
     *   the offset within the method to the entry pointer 
     */
    return entry_ptr_native_ + caller_ofs;
}